

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  QLatin1StringView str;
  QAnyStringView s;
  QAnyStringView s_00;
  QAnyStringView s_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  QtInstallDirectoryWithTriple *pQVar8;
  undefined8 uVar9;
  long lVar10;
  char **in_RSI;
  long in_FS_OFFSET;
  bool androidTemplatetCopied;
  QString appLibPath;
  const_iterator it;
  Options options;
  QCoreApplication a;
  ArgBase *argBases [4];
  undefined4 in_stack_fffffffffffff6c0;
  undefined4 in_stack_fffffffffffff6c4;
  Options *in_stack_fffffffffffff6c8;
  Options *pOVar11;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 in_stack_fffffffffffff6d0;
  Options *in_stack_fffffffffffff6d8;
  Options *in_stack_fffffffffffff6e0;
  Options *in_stack_fffffffffffff6e8;
  Options *in_stack_fffffffffffff6f0;
  Options *in_stack_fffffffffffff718;
  Options *in_stack_fffffffffffff720;
  Options *in_stack_fffffffffffff728;
  Options *in_stack_fffffffffffff730;
  Options *in_stack_fffffffffffff738;
  Options *in_stack_fffffffffffff748;
  Options *options_00;
  Options *local_890;
  Options *in_stack_fffffffffffff7a0;
  bool local_855;
  int local_844;
  Options *in_stack_fffffffffffff7d8;
  Options *in_stack_fffffffffffff810;
  QLatin1StringView local_7c8;
  qint64 local_7b8;
  Data *local_7b0;
  char16_t *local_7a8;
  piter local_7a0;
  piter local_790;
  byte local_708 [2];
  byte local_706;
  byte local_705;
  byte local_704;
  byte local_702;
  PackageType in_stack_fffffffffffffa04;
  QString QStack_568;
  QString QStack_550;
  QString aQStack_538 [14];
  QString aQStack_3e8 [4];
  int local_37c;
  Options *in_stack_fffffffffffffc98;
  byte local_1a8;
  QString aQStack_1a0 [6];
  byte local_108;
  undefined8 local_f8;
  undefined8 local_f0;
  int local_e4 [5];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [24];
  qsizetype local_68;
  char *local_60;
  ulong local_58;
  ArgBase **local_50;
  ulong local_48;
  ArgBase **local_40;
  ulong local_38;
  ArgBase **local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_f8 = 0xaaaaaaaaaaaaaaaa;
  local_f0 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_f8,local_e4,in_RSI,0x60a00);
  memset(local_708,0xaa,0x610);
  parseOptions();
  if (((local_708[0] & 1) != 0) || (bVar1 = QString::isEmpty((QString *)0x137cb8), bVar1)) {
    printHelp();
    local_844 = 1;
  }
  else {
    QElapsedTimer::start();
    bVar1 = readInputFile(in_stack_fffffffffffffc98);
    if (bVar1) {
      if ((local_706 & 1) != 0) {
        in_stack_fffffffffffff7a0 = _stdout;
        uVar9 = QElapsedTimer::nsecsElapsed();
        fprintf((FILE *)in_stack_fffffffffffff7a0,"[TIMING] %lld ns: Read input file\n",uVar9);
      }
      pOVar11 = _stdout;
      QtPrivate::asString(&QStack_550);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
      pcVar4 = QByteArray::constData((QByteArray *)0x137dab);
      QtPrivate::asString(&QStack_568);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
      pcVar5 = QByteArray::constData((QByteArray *)0x137de4);
      QtPrivate::asString(aQStack_538);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
      pcVar6 = QByteArray::constData((QByteArray *)0x137e1d);
      QtPrivate::asString(aQStack_3e8);
      QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
      pcVar7 = QByteArray::constData((QByteArray *)0x137e56);
      local_855 = false;
      if ((local_1a8 & 1) == 0) {
        local_890 = (Options *)0x180bb8;
      }
      else {
        local_855 = QString::isEmpty((QString *)0x137e85);
        if (local_855) {
          local_890 = (Options *)0x180ba9;
        }
        else {
          QtPrivate::asString(aQStack_1a0);
          QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
          local_890 = (Options *)QByteArray::constData((QByteArray *)0x137ed5);
        }
        local_855 = !local_855;
      }
      options_00 = local_890;
      fprintf((FILE *)pOVar11,
              "Generating Android Package\n  Input file: %s\n  Output directory: %s\n  Application binary: %s\n  Android build platform: %s\n  Install to device: %s\n"
              ,pcVar4,pcVar5,pcVar6,pcVar7);
      if (local_855) {
        QByteArray::~QByteArray((QByteArray *)0x137f5b);
      }
      QByteArray::~QByteArray((QByteArray *)0x137f68);
      QByteArray::~QByteArray((QByteArray *)0x137f75);
      QByteArray::~QByteArray((QByteArray *)0x137f82);
      QByteArray::~QByteArray((QByteArray *)0x137f8f);
      bVar1 = false;
      local_790.bucket = 0xaaaaaaaaaaaaaaaa;
      local_790.d = (Data<QHashPrivate::Node<QString,_QtInstallDirectoryWithTriple>_> *)
                    0xaaaaaaaaaaaaaaaa;
      local_790 = (piter)QHash<QString,_QtInstallDirectoryWithTriple>::constBegin
                                   ((QHash<QString,_QtInstallDirectoryWithTriple> *)
                                    in_stack_fffffffffffff6d8);
      while( true ) {
        local_7a0 = (piter)QHash<QString,_QtInstallDirectoryWithTriple>::constEnd
                                     ((QHash<QString,_QtInstallDirectoryWithTriple> *)
                                      in_stack_fffffffffffff6c8);
        bVar2 = QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::operator!=
                          ((const_iterator *)in_stack_fffffffffffff6c8,
                           (const_iterator *)
                           CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
        if (!bVar2) break;
        pQVar8 = QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::operator->
                           ((const_iterator *)0x138028);
        if ((pQVar8->enabled & 1U) != 0) {
          QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::key
                    ((const_iterator *)0x138040);
          QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::value
                    ((const_iterator *)0x138055);
          QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::value
                    ((const_iterator *)0x13806a);
          Options::setCurrentQtArchitecture
                    (in_stack_fffffffffffff730,(QString *)in_stack_fffffffffffff728,
                     (QString *)in_stack_fffffffffffff720,
                     (QHash<QString,_QString> *)in_stack_fffffffffffff718);
          if (((!bVar1) && ((local_705 & 1) != 0)) && ((local_702 & 1) == 0)) {
            cleanAndroidFiles(in_stack_fffffffffffff6e8);
            pOVar11 = _stdout;
            if ((local_706 & 1) != 0) {
              uVar9 = QElapsedTimer::nsecsElapsed();
              fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Cleaned Android file\n",uVar9);
            }
            bVar1 = copyAndroidTemplate(in_stack_fffffffffffff6f0);
            if (!bVar1) {
              local_844 = 3;
              goto LAB_00138d15;
            }
            if ((local_706 & 1) != 0) {
              in_stack_fffffffffffff748 = _stdout;
              uVar9 = QElapsedTimer::nsecsElapsed();
              fprintf((FILE *)in_stack_fffffffffffff748,
                      "[TIMING] %lld ns: Copied Android template\n",uVar9);
            }
            bVar1 = true;
          }
          bVar2 = readDependencies(in_stack_fffffffffffff748);
          pOVar11 = _stdout;
          if (!bVar2) {
            local_844 = 4;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Read dependencies\n",uVar9);
          }
          bVar2 = copyQtFiles(options_00);
          if (!bVar2) {
            local_844 = 6;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            in_stack_fffffffffffff738 = _stdout;
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)in_stack_fffffffffffff738,"[TIMING] %lld ns: Copied Qt files\n",uVar9);
          }
          bVar2 = copyAndroidExtraLibs(in_stack_fffffffffffff738);
          if (!bVar2) {
            local_844 = 10;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            in_stack_fffffffffffff730 = _stdout;
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)in_stack_fffffffffffff730,"[TIMING] %lld ms: Copied extra libs\n",uVar9)
            ;
          }
          bVar2 = copyAndroidExtraResources(in_stack_fffffffffffff728);
          if (!bVar2) {
            local_844 = 0x13;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            in_stack_fffffffffffff728 = _stdout;
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)in_stack_fffffffffffff728,"[TIMING] %lld ns: Copied extra resources\n",
                    uVar9);
          }
          bVar2 = copyStdCpp((Options *)in_stack_fffffffffffff6d0.m_data);
          if (!bVar2) {
            local_844 = 5;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            in_stack_fffffffffffff720 = _stdout;
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)in_stack_fffffffffffff720,"[TIMING] %lld ns: Copied GNU STL\n",uVar9);
          }
          if (((local_108 & 1) != 0) &&
             (iVar3 = generateJavaQmlComponents(in_stack_fffffffffffff810), iVar3 == 0)) {
            local_844 = 0x16;
            goto LAB_00138d15;
          }
          if ((local_706 & 1) != 0) {
            in_stack_fffffffffffff718 = _stdout;
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)in_stack_fffffffffffff718,
                    "[TIMING] %lld ns: Generate Java QtQuickViewContents.\n",uVar9);
          }
          if (local_37c == 1) {
            local_7b8 = -0x5555555555555556;
            local_7b0 = (Data *)0xaaaaaaaaaaaaaaaa;
            local_7a8 = (char16_t *)0xaaaaaaaaaaaaaaaa;
            local_7c8 = Qt::Literals::StringLiterals::operator____L1
                                  (&in_stack_fffffffffffff6c8->helpRequested,
                                   CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
            in_stack_fffffffffffff7d8 = (Options *)&local_7c8;
            local_68 = local_7c8.m_size;
            local_60 = local_7c8.m_data;
            str.m_data = &in_stack_fffffffffffff6d8->helpRequested;
            str.m_size = (qsizetype)in_stack_fffffffffffff6d0.m_data;
            QAnyStringView::QAnyStringView((QAnyStringView *)in_stack_fffffffffffff6c8,str);
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff6d0.m_data,
                       (QString *)in_stack_fffffffffffff6c8);
            s.m_size = (size_t)in_stack_fffffffffffff6d8;
            s.field_0.m_data = in_stack_fffffffffffff6d0.m_data;
            QtPrivate::qStringLikeToArg(s);
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff6d0.m_data,
                       (QString *)in_stack_fffffffffffff6c8);
            s_00.m_size = (size_t)in_stack_fffffffffffff6d8;
            s_00.field_0.m_data = in_stack_fffffffffffff6d0.m_data;
            QtPrivate::qStringLikeToArg(s_00);
            QAnyStringView::QAnyStringView
                      ((QAnyStringView *)in_stack_fffffffffffff6d0.m_data,
                       (QString *)in_stack_fffffffffffff6c8);
            s_01.m_size = (size_t)in_stack_fffffffffffff6d8;
            s_01.field_0.m_data = in_stack_fffffffffffff6d0.m_data;
            QtPrivate::qStringLikeToArg(s_01);
            local_38 = local_58;
            local_30 = local_50;
            local_28 = local_80;
            local_20 = local_a8;
            local_18 = local_d0;
            local_10 = 0;
            local_48 = local_58;
            local_40 = local_50;
            QtPrivate::argToQString((QAnyStringView *)&local_7b8,local_58,local_50);
            QFile::remove((QString *)&local_7b8);
            QString::~QString((QString *)0x13872c);
          }
          else {
            bVar2 = containsApplicationBinary(in_stack_fffffffffffff6d8);
            if (!bVar2) {
              local_844 = 7;
              goto LAB_00138d15;
            }
          }
          pOVar11 = _stdout;
          if ((local_706 & 1) != 0) {
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Checked for application binary\n",uVar9);
          }
          pOVar11 = _stdout;
          if ((local_706 & 1) != 0) {
            uVar9 = QElapsedTimer::nsecsElapsed();
            fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Bundled Qt libs\n",uVar9);
          }
        }
        QHash<QString,_QtInstallDirectoryWithTriple>::const_iterator::operator++
                  ((const_iterator *)in_stack_fffffffffffff6d0.m_data);
      }
      if ((local_702 & 1) == 0) {
        bVar1 = createRcc(in_stack_fffffffffffff720);
        if (bVar1) {
          if ((local_704 & 1) == 0) {
            if ((local_705 & 1) != 0) {
              bVar1 = copyAndroidSources(in_stack_fffffffffffff6c8);
              pOVar11 = _stdout;
              if (!bVar1) {
                local_844 = 0xb;
                goto LAB_00138d15;
              }
              if ((local_706 & 1) != 0) {
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Copied android sources\n",uVar9);
              }
              bVar1 = updateAndroidFiles(local_890);
              pOVar11 = _stdout;
              if (!bVar1) {
                local_844 = 0xc;
                goto LAB_00138d15;
              }
              if ((local_706 & 1) != 0) {
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Updated files\n",uVar9);
              }
              if ((local_706 & 1) != 0) {
                pOVar11 = _stdout;
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)pOVar11,"[TIMING] %lld ns: Created project\n",uVar9);
              }
              bVar1 = buildAndroidProject(in_stack_fffffffffffff7d8);
              if (!bVar1) {
                local_844 = 0xe;
                goto LAB_00138d15;
              }
              if ((local_706 & 1) != 0) {
                in_stack_fffffffffffff6e8 = _stdout;
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)in_stack_fffffffffffff6e8,"[TIMING] %lld ns: Built project\n",uVar9)
                ;
              }
              bVar1 = QString::isEmpty((QString *)0x138a87);
              if ((!bVar1) && (bVar1 = signPackage(in_stack_fffffffffffff6e8), !bVar1)) {
                local_844 = 0xf;
                goto LAB_00138d15;
              }
              bVar1 = QString::isEmpty((QString *)0x138acb);
              if ((!bVar1) && (bVar1 = copyPackage(in_stack_fffffffffffff6c8), !bVar1)) {
                local_844 = 0x14;
                goto LAB_00138d15;
              }
              if ((local_706 & 1) != 0) {
                in_stack_fffffffffffff6e0 = _stdout;
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)in_stack_fffffffffffff6e0,"[TIMING] %lld ns: Signed package\n",uVar9
                       );
              }
            }
            if (((local_1a8 & 1) == 0) || (bVar1 = installApk(in_stack_fffffffffffff6e0), bVar1)) {
              if ((local_706 & 1) != 0) {
                in_stack_fffffffffffff6d8 = _stdout;
                uVar9 = QElapsedTimer::nsecsElapsed();
                fprintf((FILE *)in_stack_fffffffffffff6d8,"[TIMING] %lld ns: Installed APK\n",uVar9)
                ;
              }
              bVar1 = QString::isEmpty((QString *)0x138bd5);
              if (!bVar1) {
                writeDependencyFile((Options *)
                                    CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
              }
              pOVar11 = _stdout;
              lVar10 = QElapsedTimer::elapsed();
              fprintf((FILE *)pOVar11,"Android package built successfully in %.3f ms.\n",
                      (double)lVar10 / 1000.0);
              if ((local_1a8 & 1) != 0) {
                fprintf((FILE *)_stdout,
                        "  -- It can now be run from the selected device/emulator.\n");
              }
              pOVar11 = _stdout;
              QString::isEmpty((QString *)0x138c6f);
              packagePath(in_stack_fffffffffffff7a0,in_stack_fffffffffffffa04);
              QtPrivate::asString((QString *)&stack0xfffffffffffff808);
              QString::toLocal8Bit((QString *)in_stack_fffffffffffff6d8);
              pcVar4 = QByteArray::constData((QByteArray *)0x138cc0);
              fprintf((FILE *)pOVar11,"  -- File: %s\n",pcVar4);
              QByteArray::~QByteArray((QByteArray *)0x138ce3);
              QString::~QString((QString *)0x138cf0);
              fflush((FILE *)_stdout);
              local_844 = 0;
            }
            else {
              local_844 = 0x10;
            }
          }
          else {
            bVar1 = updateAndroidFiles(local_890);
            if (bVar1) {
              local_844 = 0;
            }
            else {
              local_844 = 0xc;
            }
          }
        }
        else {
          local_844 = 0x15;
        }
      }
      else {
        bVar1 = QString::isEmpty((QString *)0x13881c);
        if (!bVar1) {
          writeDependencyFile((Options *)
                              CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
        }
        local_844 = 0;
      }
    }
    else {
      local_844 = 2;
    }
  }
LAB_00138d15:
  Options::~Options((Options *)CONCAT44(in_stack_fffffffffffff6c4,in_stack_fffffffffffff6c0));
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_f8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_844;
  }
  __stack_chk_fail();
}

Assistant:

int main(int argc, char *argv[])
{
    QCoreApplication a(argc, argv);

    Options options = parseOptions();
    if (options.helpRequested || options.outputDirectory.isEmpty()) {
        printHelp();
        return SyntaxErrorOrHelpRequested;
    }

    options.timer.start();

    if (!readInputFile(&options))
        return CannotReadInputFile;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Read input file\n", options.timer.nsecsElapsed());

    fprintf(stdout,
            "Generating Android Package\n"
            "  Input file: %s\n"
            "  Output directory: %s\n"
            "  Application binary: %s\n"
            "  Android build platform: %s\n"
            "  Install to device: %s\n",
            qPrintable(options.inputFileName),
            qPrintable(options.outputDirectory),
            qPrintable(options.applicationBinary),
            qPrintable(options.androidPlatform),
            options.installApk
                ? (options.installLocation.isEmpty() ? "Default device" : qPrintable(options.installLocation))
                : "No"
            );

    bool androidTemplatetCopied = false;

    for (auto it = options.architectures.constBegin(); it != options.architectures.constEnd(); ++it) {
        if (!it->enabled)
            continue;
        options.setCurrentQtArchitecture(it.key(),
                                         it.value().qtInstallDirectory,
                                         it.value().qtDirectories);

        // All architectures have a copy of the gradle files but only one set needs to be copied.
        if (!androidTemplatetCopied && options.build && !options.copyDependenciesOnly) {
            cleanAndroidFiles(options);
            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Cleaned Android file\n", options.timer.nsecsElapsed());

            if (!copyAndroidTemplate(options))
                return CannotCopyAndroidTemplate;

            if (Q_UNLIKELY(options.timing))
                fprintf(stdout, "[TIMING] %lld ns: Copied Android template\n", options.timer.nsecsElapsed());
            androidTemplatetCopied = true;
        }

        if (!readDependencies(&options))
            return CannotReadDependencies;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Read dependencies\n", options.timer.nsecsElapsed());

        if (!copyQtFiles(&options))
            return CannotCopyQtFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied Qt files\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraLibs(&options))
            return CannotCopyAndroidExtraLibs;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ms: Copied extra libs\n", options.timer.nsecsElapsed());

        if (!copyAndroidExtraResources(&options))
            return CannotCopyAndroidExtraResources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied extra resources\n", options.timer.nsecsElapsed());

        if (!copyStdCpp(&options))
            return CannotCopyGnuStl;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied GNU STL\n", options.timer.nsecsElapsed());

        if (options.generateJavaQmlComponents) {
            if (!generateJavaQmlComponents(options))
                return CannotGenerateJavaQmlComponents;
        }

        if (Q_UNLIKELY(options.timing)) {
            fprintf(stdout, "[TIMING] %lld ns: Generate Java QtQuickViewContents.\n",
                    options.timer.nsecsElapsed());
        }

        // If Unbundled deployment is used, remove app lib as we don't want it packaged inside the APK
        if (options.deploymentMechanism == Options::Unbundled) {
            QString appLibPath = "%1/libs/%2/lib%3_%2.so"_L1.
                    arg(options.outputDirectory,
                        options.currentArchitecture,
                        options.applicationBinary);
            QFile::remove(appLibPath);
        } else if (!containsApplicationBinary(&options)) {
            return CannotFindApplicationBinary;
        }

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Checked for application binary\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Bundled Qt libs\n", options.timer.nsecsElapsed());
    }

    if (options.copyDependenciesOnly) {
        if (!options.depFilePath.isEmpty())
            writeDependencyFile(options);
        return 0;
    }

    if (!createRcc(options))
        return CannotCreateRcc;

    if (options.auxMode) {
        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;
        return 0;
    }

    if (options.build) {
        if (!copyAndroidSources(options))
            return CannotCopyAndroidSources;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Copied android sources\n", options.timer.nsecsElapsed());

        if (!updateAndroidFiles(options))
            return CannotUpdateAndroidFiles;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Updated files\n", options.timer.nsecsElapsed());

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Created project\n", options.timer.nsecsElapsed());

        if (!buildAndroidProject(options))
            return CannotBuildAndroidProject;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Built project\n", options.timer.nsecsElapsed());

        if (!options.keyStore.isEmpty() && !signPackage(options))
            return CannotSignPackage;

        if (!options.apkPath.isEmpty() && !copyPackage(options))
            return CannotCopyApk;

        if (Q_UNLIKELY(options.timing))
            fprintf(stdout, "[TIMING] %lld ns: Signed package\n", options.timer.nsecsElapsed());
    }

    if (options.installApk && !installApk(options))
        return CannotInstallApk;

    if (Q_UNLIKELY(options.timing))
        fprintf(stdout, "[TIMING] %lld ns: Installed APK\n", options.timer.nsecsElapsed());

    if (!options.depFilePath.isEmpty())
        writeDependencyFile(options);

    fprintf(stdout, "Android package built successfully in %.3f ms.\n", options.timer.elapsed() / 1000.);

    if (options.installApk)
        fprintf(stdout, "  -- It can now be run from the selected device/emulator.\n");

    fprintf(stdout, "  -- File: %s\n", qPrintable(packagePath(options, options.keyStore.isEmpty() ? UnsignedAPK
                                                                                              : SignedAPK)));
    fflush(stdout);
    return 0;
}